

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::readConfig_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this)

{
  Client *client;
  allocator<char> local_91;
  uint *local_90;
  undefined8 local_88;
  uint local_80 [2];
  undefined4 uStack_78;
  undefined4 uStack_74;
  uint *local_70;
  undefined8 local_68;
  uint local_60 [2];
  undefined4 uStack_58;
  undefined4 uStack_54;
  string local_50;
  Url local_30;
  
  if (this->version_ == v2) {
    client = this->client_;
    Vault::operator+(&local_50,"/v1/",&this->mount_);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"/config",&local_91);
    local_68 = local_88;
    local_70 = local_60;
    if (local_90 == local_80) {
      uStack_58 = uStack_78;
      uStack_54 = uStack_74;
    }
    else {
      local_70 = local_90;
    }
    local_88 = 0;
    local_80[0] = local_80[0] & 0xffffff00;
    local_90 = local_80;
    (*client->_vptr_Client[3])(&local_30,client,&local_50);
    HttpConsumer::get(__return_storage_ptr__,client,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::KeyValue::readConfig() {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::get(
      client_, client_.getUrl("/v1/" + mount_, Vault::Path{"/config"}));
}